

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_basic_default
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *this_00;
  mapped_type_conflict *pmVar4;
  String *this_01;
  allocator<char> local_34b;
  allocator<char> local_34a;
  allocator<char> local_349;
  StringIntMap bindingPoints;
  StringVector list;
  String local_2f8;
  String local_2d8;
  String local_2b8;
  String decl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_260 [32];
  String local_240;
  string local_220 [32];
  string local_200 [32];
  String local_1e0;
  String local_1c0;
  StringStream s;
  undefined4 extraout_var_01;
  
  StringStream::StringStream(&s);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&decl,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
            (&bindingPoints,this,&decl);
  poVar3 = std::operator<<((ostream *)&s,(string *)&bindingPoints);
  std::operator<<(poVar3,";\n");
  std::__cxx11::string::~string((string *)&bindingPoints);
  std::__cxx11::string::~string((string *)&decl);
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,"UNIFORM_ACCESS",(String *)&bindingPoints);
  std::__cxx11::string::~string((string *)&bindingPoints);
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bindingPoints,*(char **)CONCAT44(extraout_var,iVar2),&local_349);
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
            (&local_2d8,this,&local_2f8);
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,*(char **)(CONCAT44(extraout_var_00,iVar2) + 0x18),&local_34a);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_260,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])(&list,this,local_260)
  ;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_200,this,0);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"float",&local_34b);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
            (&local_1c0,this,local_200,local_220);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_1e0,this,0);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_240._M_string_length = 0;
  local_240.field_2._M_local_buf[0] = '\0';
  buildUniformDecl(&decl,this,(String *)&bindingPoints,&local_2d8,&local_2b8,(String *)&list,
                   &local_1c0,&local_1e0,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string((string *)&list);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&bindingPoints);
  setTemplateParam(this,"UNIFORM_DECL",&decl);
  updateTemplate(this);
  iVar2 = (*(this->super_IProgramContextSupplier)._vptr_IProgramContextSupplier[6])
                    (&this->super_IProgramContextSupplier);
  this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar2);
  bVar1 = LayoutBindingProgram::compiledAndLinked(this_00);
  if (!bVar1) {
    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&bindingPoints,this_00,false);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    std::__cxx11::string::string
              ((string *)&__return_storage_ptr__->m_reason,(string *)&bindingPoints);
    std::__cxx11::string::~string((string *)&bindingPoints);
    goto LAB_00be2222;
  }
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
            (&bindingPoints,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
            (&local_2d8,this,&bindingPoints);
  std::__cxx11::string::~string((string *)&bindingPoints);
  if (local_2d8._M_string_length == 0) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
              (&bindingPoints,this,0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bindingPoints);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &bindingPoints,&local_2d8,"_block");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bindingPoints);
  }
  std::__cxx11::string::~string((string *)&bindingPoints);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_278,&list);
  (*this_00->_vptr_LayoutBindingProgram[3])(&bindingPoints,this_00,&local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  if (bindingPoints._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (long)list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&bindingPoints,&local_2d8);
    if (*pmVar4 != 0) goto LAB_00be2190;
    local_2f8._M_string_length = 0;
    local_2f8.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_passed = true;
    __return_storage_ptr__->m_notRunForThisContext = false;
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&local_2f8);
    this_01 = &local_2f8;
  }
  else {
LAB_00be2190:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"binding point did not match default",
               (allocator<char> *)local_260);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&bindingPoints,&local_2d8);
    generateLog<int,int>(&local_2f8,this,&local_2b8,*pmVar4,0);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    this_01 = &local_2b8;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&bindingPoints._M_t);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
LAB_00be2222:
  (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
  std::__cxx11::string::~string((string *)&decl);
  StringStream::~StringStream(&s);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_basic_default()
{
	bool passed = true;

	StringStream s;
	s << buildAccess(getDefaultUniformName()) << ";\n";
	setTemplateParam("UNIFORM_ACCESS", s.str());

	String decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(String()),
								   String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								   buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
	setTemplateParam("UNIFORM_DECL", decl);
	updateTemplate();

	LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
	passed &= program->compiledAndLinked();
	if (!passed)
	{
		return LayoutBindingTestResult(passed, program->getErrorLog());
	}

	StringVector  list;
	const String& u = buildBlockName(getDefaultUniformName());
	if (!u.empty())
		list.push_back(u + "_block");
	else
		list.push_back(getDefaultUniformName());

	StringIntMap bindingPoints = program->getBindingPoints(list);

	passed &= bindingPoints.size() == list.size() && (bindingPoints[u] == 0);
	if (!passed)
	{
		return LayoutBindingTestResult(passed,
									   generateLog(String("binding point did not match default"), bindingPoints[u], 0));
	}

	return true;
}